

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

bool __thiscall
absl::numbers_internal::safe_strtou128_base
          (numbers_internal *this,string_view text,Nonnull<uint128_*> value,int base)

{
  numbers_internal *pnVar1;
  numbers_internal nVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  undefined1 (*pauVar10) [16];
  numbers_internal *pnVar11;
  ulong uVar12;
  numbers_internal *pnVar13;
  numbers_internal *pnVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  numbers_internal *pnVar19;
  undefined1 auVar20 [16];
  
  uVar9 = (uint)value;
  pauVar10 = (undefined1 (*) [16])text._M_str;
  pnVar19 = (numbers_internal *)text._M_len;
  *pauVar10 = (undefined1  [16])0x0;
  bVar8 = true;
  pnVar13 = pnVar19;
  if (pnVar19 == (numbers_internal *)0x0) goto LAB_00264630;
  pnVar11 = pnVar19;
  if (0 < (long)this) {
    do {
      if (((&ascii_internal::kPropertyBits)[(byte)*pnVar11] & 8) == 0) break;
      pnVar11 = pnVar11 + 1;
    } while (pnVar11 < pnVar19 + (long)this);
  }
  pnVar14 = pnVar19 + 1;
  do {
    if (pnVar13 + (long)this <= pnVar11) goto LAB_00264630;
    pnVar1 = pnVar13 + -1;
    pnVar14 = pnVar14 + -1;
    pnVar13 = pnVar13 + -1;
  } while (((&ascii_internal::kPropertyBits)[(byte)pnVar1[(long)this]] & 8) != 0);
  nVar2 = *pnVar11;
  pnVar1 = pnVar13 + (long)this;
  pnVar13 = (numbers_internal *)(ulong)(nVar2 == (numbers_internal)0x2d);
  if (((nVar2 == (numbers_internal)0x2d) || (nVar2 == (numbers_internal)0x2b)) &&
     (pnVar11 = pnVar11 + 1, pnVar1 + 1 <= pnVar11)) goto LAB_00264630;
  if (uVar9 == 0x10) {
    uVar16 = 0x10;
    if (((1 < (long)(pnVar14 + ((long)this - (long)pnVar11))) &&
        (*pnVar11 == (numbers_internal)0x30)) && (((byte)pnVar11[1] | 0x20) == 0x78)) {
LAB_00264764:
      pnVar11 = pnVar11 + 2;
      uVar16 = 0x10;
      if (pnVar1 + 1 <= pnVar11) goto LAB_00264630;
    }
  }
  else if (uVar9 == 0) {
    if (((1 < (long)(pnVar14 + ((long)this - (long)pnVar11))) &&
        (*pnVar11 == (numbers_internal)0x30)) && (((byte)pnVar11[1] | 0x20) == 0x78))
    goto LAB_00264764;
    if ((long)(pnVar14 + ((long)this - (long)pnVar11)) < 1) {
      uVar16 = 10;
    }
    else {
      nVar2 = *pnVar11;
      pnVar11 = pnVar11 + (nVar2 == (numbers_internal)0x30);
      uVar16 = (uint)(nVar2 != (numbers_internal)0x30) * 2 + 8;
    }
  }
  else {
    uVar16 = uVar9;
    if (0x22 < uVar9 - 2) goto LAB_00264630;
  }
  uVar9 = uVar16;
  this = pnVar14 + ((long)this - (long)pnVar11);
  bVar8 = false;
  pnVar19 = pnVar11;
LAB_00264630:
  if (((ulong)pnVar13 & 1) == 0 && !bVar8) {
    if ((int)uVar9 < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0x3da,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::uint128]"
                   );
    }
    uVar18 = CONCAT44(0,uVar9);
    uVar3 = *(ulong *)*(undefined1 (*) [16])
                       ((anonymous_namespace)::LookupTables<absl::uint128>::kVmaxOverBase +
                       uVar18 * 0x10);
    uVar4 = *(ulong *)((anonymous_namespace)::LookupTables<absl::uint128>::kVmaxOverBase +
                      uVar18 * 0x10 + 8);
    auVar5 = *(undefined1 (*) [16])
              ((anonymous_namespace)::LookupTables<absl::uint128>::kVmaxOverBase + uVar18 * 0x10);
    if ((1 < (int)uVar9) &&
       (auVar20 = __udivti3(0xffffffffffffffff,0xffffffffffffffff,uVar18,0), auVar20 != auVar5)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                    ,0x3df,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::uint128]"
                   );
    }
    bVar8 = (long)this < 1;
    if ((long)this < 1) {
      uVar12 = 0;
      uVar7 = 0;
    }
    else {
      pnVar13 = this + (long)pnVar19;
      bVar8 = false;
      uVar7 = 0;
      uVar12 = 0;
      do {
        uVar17 = (ulong)(char)(anonymous_namespace)::kAsciiToInt[(byte)*pnVar19];
        uVar15 = (ulong)((char)(anonymous_namespace)::kAsciiToInt[(byte)*pnVar19] >> 7);
        if ((uVar17 < uVar18) <= uVar15) {
          *(ulong *)*pauVar10 = uVar7;
          *(ulong *)(*pauVar10 + 8) = uVar12;
          return bVar8;
        }
        if (uVar4 < uVar12 || uVar4 - uVar12 < (ulong)(uVar3 < uVar7)) {
LAB_00264712:
          *(undefined4 *)*pauVar10 = 0xffffffff;
          *(undefined4 *)(*pauVar10 + 4) = 0xffffffff;
          *(undefined4 *)(*pauVar10 + 8) = 0xffffffff;
          *(undefined4 *)(*pauVar10 + 0xc) = 0xffffffff;
          return bVar8;
        }
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar7;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar18;
        uVar6 = SUB168(auVar5 * auVar20,0);
        uVar12 = SUB168(auVar5 * auVar20,8) + uVar12 * uVar18;
        if (~uVar15 < uVar12 || ~uVar15 - uVar12 < (ulong)(~uVar17 < uVar6)) goto LAB_00264712;
        uVar7 = uVar6 + uVar17;
        uVar12 = uVar15 + uVar12 + (ulong)CARRY8(uVar6,uVar17);
        pnVar19 = pnVar19 + 1;
        bVar8 = pnVar19 >= pnVar13;
      } while (pnVar19 < pnVar13);
    }
    *(ulong *)*pauVar10 = uVar7;
    *(ulong *)(*pauVar10 + 8) = uVar12;
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool safe_strtou128_base(absl::string_view text, absl::Nonnull<uint128*> value,
                         int base) {
  return safe_uint_internal<absl::uint128>(text, value, base);
}